

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# awssyncer.cc
# Opt level: O1

string * GetEnvironmentVariable(string *__return_storage_ptr__,string *name)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  __s = getenv((name->_M_dataplus)._M_p);
  if (__s != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
    return __return_storage_ptr__;
  }
  poVar2 = Log();
  poVar2 = std::operator<<(poVar2,"Missing environment variable: ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar2);
  abort();
}

Assistant:

static std::string GetEnvironmentVariable(const std::string& name) {
  const char* value = std::getenv(name.c_str());
  if (value == nullptr) {
    Log() << "Missing environment variable: " << name << std::endl;
    std::abort();
  }
  return value;
}